

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * increment(Bigint *b)

{
  int iVar1;
  ULong *pUVar2;
  Bigint *pBVar3;
  long lVar4;
  
  pUVar2 = b->x;
  iVar1 = b->wds;
  do {
    if (*pUVar2 != 0xffffffff) {
      *pUVar2 = *pUVar2 + 1;
      return b;
    }
    *pUVar2 = 0;
    pUVar2 = pUVar2 + 1;
  } while (pUVar2 < b->x + iVar1);
  if (b->maxwds <= b->wds) {
    pBVar3 = Balloc(b->k + 1);
    memcpy(&pBVar3->sign,&b->sign,(long)b->wds * 4 + 8);
    lVar4 = (long)b->k;
    if (lVar4 < 8) {
      b->next = TI0.Freelist[lVar4];
      TI0.Freelist[lVar4] = b;
      b = pBVar3;
    }
    else {
      free(b);
      b = pBVar3;
    }
  }
  iVar1 = b->wds;
  b->wds = iVar1 + 1;
  b->x[iVar1] = 1;
  return b;
}

Assistant:

static Bigint *
increment(Bigint *b MTd)
{
	ULong *x, *xe;
	Bigint *b1;

	x = b->x;
	xe = x + b->wds;
	do {
		if (*x < (ULong)0xffffffffL) {
			++*x;
			return b;
			}
		*x++ = 0;
		} while(x < xe);
	{
		if (b->wds >= b->maxwds) {
			b1 = Balloc(b->k+1 MTa);
			Bcopy(b1,b);
			Bfree(b MTa);
			b = b1;
			}
		b->x[b->wds++] = 1;
		}
	return b;
	}